

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

bool __thiscall
DepsLog::RecordDeps(DepsLog *this,Node *node,TimeStamp mtime,int node_count,Node **nodes)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  Deps *this_00;
  int local_78;
  int i_3;
  Deps *deps;
  undefined4 local_58;
  int i_2;
  uint32_t mtime_part;
  int id;
  uint size;
  int i_1;
  Deps *deps_1;
  int i;
  bool made_change;
  Node **nodes_local;
  TimeStamp TStack_28;
  int node_count_local;
  TimeStamp mtime_local;
  Node *node_local;
  DepsLog *this_local;
  
  deps_1._7_1_ = 0;
  _i = nodes;
  nodes_local._4_4_ = node_count;
  TStack_28 = mtime;
  mtime_local = (TimeStamp)node;
  node_local = (Node *)this;
  iVar2 = Node::id(node);
  if (iVar2 < 0) {
    bVar1 = RecordId(this,(Node *)mtime_local);
    if (!bVar1) {
      return false;
    }
    deps_1._7_1_ = 1;
  }
  for (deps_1._0_4_ = 0; (int)deps_1 < nodes_local._4_4_; deps_1._0_4_ = (int)deps_1 + 1) {
    iVar2 = Node::id(_i[(int)deps_1]);
    if (iVar2 < 0) {
      bVar1 = RecordId(this,_i[(int)deps_1]);
      if (!bVar1) {
        return false;
      }
      deps_1._7_1_ = 1;
    }
  }
  if ((deps_1._7_1_ & 1) == 0) {
    _size = GetDeps(this,(Node *)mtime_local);
    if (((_size == (Deps *)0x0) || (_size->mtime != TStack_28)) ||
       (_size->node_count != nodes_local._4_4_)) {
      deps_1._7_1_ = 1;
    }
    else {
      for (id = 0; id < nodes_local._4_4_; id = id + 1) {
        if (_size->nodes[id] != _i[id]) {
          deps_1._7_1_ = 1;
          break;
        }
      }
    }
  }
  if ((deps_1._7_1_ & 1) == 0) {
    this_local._7_1_ = true;
  }
  else {
    mtime_part = (nodes_local._4_4_ + 3) * 4;
    if (mtime_part < 0x80000) {
      bVar1 = OpenForWriteIfNeeded(this);
      if (bVar1) {
        mtime_part = mtime_part | 0x80000000;
        sVar4 = fwrite(&mtime_part,4,1,(FILE *)this->file_);
        if (sVar4 == 0) {
          this_local._7_1_ = false;
        }
        else {
          i_2 = Node::id((Node *)mtime_local);
          sVar4 = fwrite(&i_2,4,1,(FILE *)this->file_);
          if (sVar4 == 0) {
            this_local._7_1_ = false;
          }
          else {
            local_58 = (undefined4)TStack_28;
            sVar4 = fwrite(&local_58,4,1,(FILE *)this->file_);
            if (sVar4 == 0) {
              this_local._7_1_ = false;
            }
            else {
              local_58 = (undefined4)((ulong)TStack_28 >> 0x20);
              sVar4 = fwrite(&local_58,4,1,(FILE *)this->file_);
              if (sVar4 == 0) {
                this_local._7_1_ = false;
              }
              else {
                for (deps._4_4_ = 0; deps._4_4_ < nodes_local._4_4_; deps._4_4_ = deps._4_4_ + 1) {
                  i_2 = Node::id(_i[deps._4_4_]);
                  sVar4 = fwrite(&i_2,4,1,(FILE *)this->file_);
                  if (sVar4 == 0) {
                    return false;
                  }
                }
                iVar2 = fflush((FILE *)this->file_);
                if (iVar2 == 0) {
                  this_00 = (Deps *)operator_new(0x18);
                  Deps::Deps(this_00,TStack_28,nodes_local._4_4_);
                  for (local_78 = 0; local_78 < nodes_local._4_4_; local_78 = local_78 + 1) {
                    this_00->nodes[local_78] = _i[local_78];
                  }
                  iVar2 = Node::id((Node *)mtime_local);
                  UpdateDeps(this,iVar2,this_00);
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
            }
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = 0x22;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DepsLog::RecordDeps(Node* node, TimeStamp mtime,
                         int node_count, Node** nodes) {
  // Track whether there's any new data to be recorded.
  bool made_change = false;

  // Assign ids to all nodes that are missing one.
  if (node->id() < 0) {
    if (!RecordId(node))
      return false;
    made_change = true;
  }
  for (int i = 0; i < node_count; ++i) {
    if (nodes[i]->id() < 0) {
      if (!RecordId(nodes[i]))
        return false;
      made_change = true;
    }
  }

  // See if the new data is different than the existing data, if any.
  if (!made_change) {
    Deps* deps = GetDeps(node);
    if (!deps ||
        deps->mtime != mtime ||
        deps->node_count != node_count) {
      made_change = true;
    } else {
      for (int i = 0; i < node_count; ++i) {
        if (deps->nodes[i] != nodes[i]) {
          made_change = true;
          break;
        }
      }
    }
  }

  // Don't write anything if there's no new info.
  if (!made_change)
    return true;

  // Update on-disk representation.
  unsigned size = 4 * (1 + 2 + node_count);
  if (size > kMaxRecordSize) {
    errno = ERANGE;
    return false;
  }

  if (!OpenForWriteIfNeeded()) {
    return false;
  }
  size |= 0x80000000;  // Deps record: set high bit.
  if (fwrite(&size, 4, 1, file_) < 1)
    return false;
  int id = node->id();
  if (fwrite(&id, 4, 1, file_) < 1)
    return false;
  uint32_t mtime_part = static_cast<uint32_t>(mtime & 0xffffffff);
  if (fwrite(&mtime_part, 4, 1, file_) < 1)
    return false;
  mtime_part = static_cast<uint32_t>((mtime >> 32) & 0xffffffff);
  if (fwrite(&mtime_part, 4, 1, file_) < 1)
    return false;
  for (int i = 0; i < node_count; ++i) {
    id = nodes[i]->id();
    if (fwrite(&id, 4, 1, file_) < 1)
      return false;
  }
  if (fflush(file_) != 0)
    return false;

  // Update in-memory representation.
  Deps* deps = new Deps(mtime, node_count);
  for (int i = 0; i < node_count; ++i)
    deps->nodes[i] = nodes[i];
  UpdateDeps(node->id(), deps);

  return true;
}